

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDsdPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  If_DsdMan_t *p;
  char *pcVar6;
  char *pcVar7;
  uint fVerbose;
  uint fOccurs;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_38 = 0;
  Extra_UtilGetoptReset();
  local_3c = 0;
  fOccurs = 0;
  local_34 = 0;
  bVar1 = false;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"NSotbvh"), iVar2 = globalUtilOptind, iVar3 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar3 < 0x62) break;
      if (iVar3 == 0x62) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else if (iVar3 == 0x6f) {
        fOccurs = fOccurs ^ 1;
      }
      else {
        if (iVar3 != 0x74) goto LAB_00263760;
        local_34 = local_34 ^ 1;
      }
    }
    if (iVar3 == -1) {
      if (bVar1) {
        pvVar5 = Abc_FrameReadManDsd2();
        if (pvVar5 == (void *)0x0) {
LAB_00263720:
          Abc_Print(-1,"The DSD manager is not started.\n");
          return 0;
        }
        p = (If_DsdMan_t *)Abc_FrameReadManDsd2();
      }
      else {
        pvVar5 = Abc_FrameReadManDsd();
        if (pvVar5 == (void *)0x0) goto LAB_00263720;
        p = (If_DsdMan_t *)Abc_FrameReadManDsd();
      }
      If_DsdManPrint(p,(char *)0x0,local_38,local_3c,fOccurs,local_34,fVerbose);
      return 0;
    }
    if (iVar3 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-N\" should be followed by a floating point number.\n";
        goto LAB_00263754;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_38 = uVar4;
    }
    else {
      if (iVar3 != 0x53) goto LAB_00263760;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-S\" should be followed by a floating point number.\n";
LAB_00263754:
        Abc_Print(-1,pcVar6);
        goto LAB_00263760;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_3c = uVar4;
    }
    globalUtilOptind = iVar2 + 1;
    if ((int)uVar4 < 0) {
LAB_00263760:
      Abc_Print(-2,"usage: dsd_ps [-NS num] [-obvh]\n");
      Abc_Print(-2,"\t         prints statistics of the DSD manager\n");
      Abc_Print(-2,"\t-N num : show structures whose ID divides by N [default = %d]\n",
                (ulong)local_38);
      Abc_Print(-2,"\t-S num : show structures whose support size is S [default = %d]\n",
                (ulong)local_3c);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (fOccurs == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-o     : toggles printing occurence distribution [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_34 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-t     : toggles dumping truth tables [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-b     : toggles processing second manager [default = %s]\n",pcVar6);
      if (fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar7);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDsdPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, Number = 0, Support = 0, fOccurs = 0, fTtDump = 0, fSecond = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NSotbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Number = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Number < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Support = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Support < 0 )
                goto usage;
            break;
        case 'o':
            fOccurs ^= 1;
            break;
        case 't':
            fTtDump ^= 1;
            break;
        case 'b':
            fSecond ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fSecond )
    {
        if ( !Abc_FrameReadManDsd2() )
        {
            Abc_Print( -1, "The DSD manager is not started.\n" );
            return 0;
        }
        If_DsdManPrint( (If_DsdMan_t *)Abc_FrameReadManDsd2(), NULL, Number, Support, fOccurs, fTtDump, fVerbose );
    }
    else
    {
        if ( !Abc_FrameReadManDsd() )
        {
            Abc_Print( -1, "The DSD manager is not started.\n" );
            return 0;
        }
        If_DsdManPrint( (If_DsdMan_t *)Abc_FrameReadManDsd(), NULL, Number, Support, fOccurs, fTtDump, fVerbose );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dsd_ps [-NS num] [-obvh]\n" );
    Abc_Print( -2, "\t         prints statistics of the DSD manager\n" );
    Abc_Print( -2, "\t-N num : show structures whose ID divides by N [default = %d]\n",   Number );
    Abc_Print( -2, "\t-S num : show structures whose support size is S [default = %d]\n", Support );
    Abc_Print( -2, "\t-o     : toggles printing occurence distribution [default = %s]\n", fOccurs? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggles dumping truth tables [default = %s]\n",            fTtDump? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggles processing second manager [default = %s]\n",       fSecond? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n",                  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}